

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::readFromBinary(Binasc *this,string *outfile,istream *input)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  int status;
  ostream local_228 [8];
  ofstream output;
  istream *input_local;
  string *outfile_local;
  Binasc *this_local;
  
  std::ofstream::ofstream(local_228);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)local_228,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)outfile);
    poVar3 = std::operator<<(poVar3," for reading in binasc.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = readFromBinary(this,local_228,input);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_228);
  return this_local._4_4_;
}

Assistant:

int Binasc::readFromBinary(const std::string& outfile, std::istream& input) {
	std::ofstream output;
	output.open(outfile.c_str());
	if (!output.is_open()) {
		std::cerr << "Cannot open " << outfile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = readFromBinary(output, input);
	output.close();
	return status;
}